

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_estimate_bits_at_q(AV1_COMP *cpi,int q,double correction_factor)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int bpm;
  int mbs;
  FRAME_TYPE frame_type;
  AV1_COMMON *cm;
  undefined4 local_30;
  
  iVar1 = *(int *)(in_RDI + 0x3c190);
  iVar2 = av1_rc_bits_per_mb((AV1_COMP *)correction_factor,cm._7_1_,(int)cm,_mbs,bpm);
  if (iVar2 * iVar1 >> 9 < 200) {
    local_30 = 200;
  }
  else {
    local_30 = iVar2 * iVar1 >> 9;
  }
  return local_30;
}

Assistant:

int av1_estimate_bits_at_q(const AV1_COMP *cpi, int q,
                           double correction_factor) {
  const AV1_COMMON *const cm = &cpi->common;
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  const int mbs = cm->mi_params.MBs;
  const int bpm =
      (int)(av1_rc_bits_per_mb(cpi, frame_type, q, correction_factor,
                               cpi->sf.hl_sf.accurate_bit_estimate));
  return AOMMAX(FRAME_OVERHEAD_BITS,
                (int)((uint64_t)bpm * mbs) >> BPER_MB_NORMBITS);
}